

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QSet<QWidget_*> __thiscall QDockAreaLayoutInfo::usedSeparatorWidgets(QDockAreaLayoutInfo *this)

{
  ulong uVar1;
  long in_RSI;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QHashDummyValue local_41;
  QWidget *local_40;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  this->sep = (int *)0x0;
  uVar3 = (uint)*(undefined8 *)(in_RSI + 0x18);
  QHash<QWidget_*,_QHashDummyValue>::reserve
            ((QHash<QWidget_*,_QHashDummyValue> *)this,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    uVar1 = 0;
    do {
      local_40 = *(QWidget **)(*(long *)(in_RSI + 0x10) + uVar1 * 8);
      QHash<QWidget*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QWidget*,QHashDummyValue> *)this,&stack0xffffffffffffffc0,&local_41);
      uVar1 = uVar1 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar1);
  }
  if (*(long *)(in_RSI + 0x50) != 0) {
    lVar2 = 8;
    uVar1 = 0;
    do {
      if (*(long *)(*(long *)(in_RSI + 0x48) + lVar2) != 0) {
        usedSeparatorWidgets((QDockAreaLayoutInfo *)&stack0xffffffffffffffc0);
        QSet<QWidget_*>::unite((QSet<QWidget_*> *)this,(QSet<QWidget_*> *)&stack0xffffffffffffffc0);
        QHash<QWidget_*,_QHashDummyValue>::~QHash
                  ((QHash<QWidget_*,_QHashDummyValue> *)&stack0xffffffffffffffc0);
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x28;
    } while (uVar1 < *(ulong *)(in_RSI + 0x50));
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSet<QWidget_*>)(Hash)this;
  }
  __stack_chk_fail();
}

Assistant:

QSet<QWidget*> QDockAreaLayoutInfo::usedSeparatorWidgets() const
{
    QSet<QWidget*> result;
    const int numSeparatorWidgets = separatorWidgets.size();
    result.reserve(numSeparatorWidgets);

    for (int i = 0; i < numSeparatorWidgets; ++i)
        result << separatorWidgets.at(i);

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.subinfo != nullptr)
            result += item.subinfo->usedSeparatorWidgets();
    }

    return result;
}